

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *pgVar1;
  gravity_lexer_t *lexer;
  size_t sVar2;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  _Bool _Var3;
  _Bool _Var4;
  gtoken_t gVar5;
  gnode_t *pgVar6;
  gnode_t *pgVar7;
  gnode_t *pgVar8;
  gnode_t *pgVar9;
  gtoken_s token;
  undefined8 local_80;
  undefined4 uStack_78;
  int iStack_74;
  undefined8 local_70;
  undefined8 uStack_68;
  char *local_60;
  int local_4c;
  int local_44;
  
  gVar5 = gravity_lexer_peek(parser->lexer->p[parser->lexer->n - 1]);
  _Var3 = token_iserror(gVar5);
  if (_Var3) {
    parse_error(parser);
    return (gnode_t *)0x0;
  }
  _Var3 = token_islabel_statement(gVar5);
  if (_Var3) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar5 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    if (gVar5 == TOK_KEY_DEFAULT) {
      pgVar6 = (gnode_t *)0x0;
    }
    else {
      if (gVar5 != TOK_KEY_CASE) {
        __assert_fail("(type == TOK_KEY_CASE) || (type == TOK_KEY_DEFAULT)",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                      ,0x862,"gnode_t *parse_label_statement(gravity_parser_t *)");
      }
      pgVar6 = parse_precedence(parser,PREC_LOWEST);
    }
    parse_required(parser,TOK_OP_COLON);
    pgVar8 = parse_statement(parser);
    sVar2 = parser->declarations->n;
    if (sVar2 == 0) {
      pgVar7 = (gnode_t *)0x0;
    }
    else {
      pgVar7 = parser->declarations->p[sVar2 - 1];
    }
    token_00.position = iStack_74;
    token_00.colno = uStack_78;
    token_00._0_8_ = local_80;
    token_00._16_8_ = local_70;
    token_00._24_8_ = uStack_68;
    token_00.value = local_60;
    pgVar6 = gnode_label_stat_create(token_00,pgVar6,pgVar8,pgVar7);
    return pgVar6;
  }
  _Var3 = token_isflow_statement(gVar5);
  if (_Var3) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar5 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    if ((gVar5 | TOK_COMMENT) != TOK_KEY_SWITCH) {
      __assert_fail("(type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH)",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x87a,"gnode_t *parse_flow_statement(gravity_parser_t *)");
    }
    parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
    pgVar7 = (gnode_t *)0x0;
    pgVar6 = parse_precedence(parser,PREC_LOWEST);
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
    pgVar8 = parse_statement(parser);
    if (gVar5 == TOK_KEY_IF) {
      gVar5 = gravity_lexer_peek(pgVar1);
      if (gVar5 == TOK_KEY_ELSE) {
        gravity_lexer_next(pgVar1);
        pgVar7 = parse_statement(parser);
      }
      else {
        pgVar7 = (gnode_t *)0x0;
      }
    }
    gravity_lexer_token(pgVar1);
    sVar2 = parser->declarations->n;
    if (sVar2 == 0) {
      pgVar9 = (gnode_t *)0x0;
    }
    else {
      pgVar9 = parser->declarations->p[sVar2 - 1];
    }
    token_01.position = iStack_74;
    token_01.colno = uStack_78;
    token_01._0_8_ = local_80;
    token_01._16_8_ = local_70;
    token_01._24_8_ = uStack_68;
    token_01.value = local_60;
    pgVar6 = gnode_flow_stat_create
                       (token_01,pgVar6,pgVar8,pgVar7,pgVar9,(local_44 + local_4c) - iStack_74);
    return pgVar6;
  }
  _Var3 = token_isloop_statement(gVar5);
  if (_Var3) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar5 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    if (2 < gVar5 - TOK_KEY_WHILE) {
      __assert_fail("(type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR)",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x8a2,"gnode_t *parse_loop_statement(gravity_parser_t *)");
    }
    if (gVar5 == TOK_KEY_FOR) {
      _Var3 = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
      gVar5 = gravity_lexer_peek(pgVar1);
      _Var4 = token_isvariable_declaration(gVar5);
      if (_Var4) {
        pgVar6 = parse_variable_declaration(parser,false,TOK_EOF,TOK_EOF);
      }
      else {
        pgVar6 = parse_precedence(parser,PREC_LOWEST);
      }
      parse_required(parser,TOK_KEY_IN);
      pgVar8 = parse_precedence(parser,PREC_LOWEST);
      if (_Var3) {
        parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
      }
      pgVar7 = parse_statement(parser);
    }
    else if (gVar5 == TOK_KEY_REPEAT) {
      pgVar7 = parse_statement(parser);
      parse_required(parser,TOK_KEY_WHILE);
      _Var3 = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
      pgVar8 = parse_precedence(parser,PREC_LOWEST);
      if (_Var3) {
        parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
      }
      lexer = parser->lexer->p[parser->lexer->n - 1];
      gVar5 = gravity_lexer_peek(lexer);
      if (gVar5 == TOK_OP_SEMICOLON) {
        gravity_lexer_next(lexer);
      }
      pgVar6 = (gnode_t *)0x0;
    }
    else {
      _Var3 = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
      pgVar6 = parse_precedence(parser,PREC_LOWEST);
      if (_Var3) {
        parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
      }
      pgVar7 = parse_statement(parser);
      pgVar8 = (gnode_t *)0x0;
    }
    gravity_lexer_token(pgVar1);
    sVar2 = parser->declarations->n;
    if (sVar2 == 0) {
      pgVar9 = (gnode_t *)0x0;
    }
    else {
      pgVar9 = parser->declarations->p[sVar2 - 1];
    }
    token_03.position = iStack_74;
    token_03.colno = uStack_78;
    token_03._0_8_ = local_80;
    token_03._16_8_ = local_70;
    token_03._24_8_ = uStack_68;
    token_03.value = local_60;
    pgVar6 = gnode_loop_stat_create
                       (token_03,pgVar6,pgVar7,pgVar8,pgVar9,(local_44 + local_4c) - iStack_74);
    return pgVar6;
  }
  _Var3 = token_isjump_statement(gVar5);
  if (!_Var3) {
    _Var3 = token_iscompound_statement(gVar5);
    if (_Var3) {
      pgVar6 = parse_compound_statement(parser);
      return pgVar6;
    }
    _Var3 = token_isdeclaration_statement(gVar5);
    if (_Var3) {
      pgVar6 = parse_declaration_statement(parser);
      return pgVar6;
    }
    _Var3 = token_isempty_statement(gVar5);
    if (_Var3) {
      pgVar6 = parse_empty_statement(parser);
      return pgVar6;
    }
    _Var3 = token_isimport_statement(gVar5);
    if (_Var3) {
      gravity_lexer_next(parser->lexer->p[parser->lexer->n - 1]);
      return (gnode_t *)0x0;
    }
    _Var3 = token_isspecial_statement(gVar5);
    if (_Var3) {
      parse_special_statement(parser);
      return (gnode_t *)0x0;
    }
    _Var3 = token_ismacro(gVar5);
    if (_Var3) {
      parse_macro_statement(parser);
      return (gnode_t *)0x0;
    }
    pgVar6 = parse_expression_statement(parser);
    return pgVar6;
  }
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar5 = gravity_lexer_next(pgVar1);
  gravity_lexer_token(pgVar1);
  if (1 < gVar5 - TOK_KEY_BREAK) {
    if (gVar5 != TOK_KEY_RETURN) {
      __assert_fail("(type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x8f7,"gnode_t *parse_jump_statement(gravity_parser_t *)");
    }
    gVar5 = gravity_lexer_peek(pgVar1);
    if ((gVar5 != TOK_OP_SEMICOLON) &&
       (gVar5 = gravity_lexer_peek(pgVar1), gVar5 != TOK_OP_CLOSED_CURLYBRACE)) {
      pgVar6 = parse_precedence(parser,PREC_LOWEST);
      goto LAB_0010f7b4;
    }
  }
  pgVar6 = (gnode_t *)0x0;
LAB_0010f7b4:
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar5 = gravity_lexer_peek(pgVar1);
  if (gVar5 == TOK_OP_SEMICOLON) {
    gravity_lexer_next(pgVar1);
  }
  sVar2 = parser->declarations->n;
  if (sVar2 == 0) {
    pgVar8 = (gnode_t *)0x0;
  }
  else {
    pgVar8 = parser->declarations->p[sVar2 - 1];
  }
  token_02.position = iStack_74;
  token_02.colno = uStack_78;
  token_02._0_8_ = local_80;
  token_02._16_8_ = local_70;
  token_02._24_8_ = uStack_68;
  token_02.value = local_60;
  pgVar6 = gnode_jump_stat_create(token_02,pgVar6,pgVar8);
  return pgVar6;
}

Assistant:

static gnode_t *parse_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_statement");

    // label_statement
    // flow_statement
    // loop_statement
    // jump_statement
    // compound_statement
    // declaration_statement
    // empty_statement
    // import_statement
    // expression_statement (default)

    DECLARE_LEXER;
    gtoken_t token = gravity_lexer_peek(lexer);
    if (token_iserror(token)) return parse_error(parser);

    if (token_islabel_statement(token)) return parse_label_statement(parser);
    else if (token_isflow_statement(token)) return parse_flow_statement(parser);
    else if (token_isloop_statement(token)) return parse_loop_statement(parser);
    else if (token_isjump_statement(token)) return parse_jump_statement(parser);
    else if (token_iscompound_statement(token)) return parse_compound_statement(parser);
    else if (token_isdeclaration_statement(token)) return parse_declaration_statement(parser);
    else if (token_isempty_statement(token)) return parse_empty_statement(parser);
    else if (token_isimport_statement(token)) return parse_import_statement(parser);
    else if (token_isspecial_statement(token)) return parse_special_statement(parser);
    else if (token_ismacro(token)) return parse_macro_statement(parser);

    return parse_expression_statement(parser); // DEFAULT
}